

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O0

bool cmCMakePresetsGraphInternal::PresetBoolHelper(bool *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  ErrorGenerator local_40;
  cmJSONState *local_20;
  cmJSONState *state_local;
  Value *value_local;
  bool *out_local;
  
  local_20 = state;
  state_local = (cmJSONState *)value;
  value_local = (Value *)out;
  if (PresetBoolHelper(bool&,Json::Value_const*,cmJSONState*)::helper == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetBoolHelper(bool&,Json::Value_const*,cmJSONState*)::helper);
    if (iVar2 != 0) {
      std::function<void(Json::Value_const*,cmJSONState*)>::
      function<void(&)(Json::Value_const*,cmJSONState*),void>
                ((function<void(Json::Value_const*,cmJSONState*)> *)&local_40,
                 JsonErrors::INVALID_BOOL);
      cmJSONHelperBuilder::Bool(&PresetBoolHelper::helper,&local_40,false);
      std::function<void_(const_Json::Value_*,_cmJSONState_*)>::~function(&local_40);
      __cxa_atexit(std::function<bool_(bool_&,_const_Json::Value_*,_cmJSONState_*)>::~function,
                   &PresetBoolHelper::helper,&__dso_handle);
      __cxa_guard_release(&PresetBoolHelper(bool&,Json::Value_const*,cmJSONState*)::helper);
    }
  }
  bVar1 = std::function<bool_(bool_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                    (&PresetBoolHelper::helper,(bool *)value_local,(Value *)state_local,local_20);
  return bVar1;
}

Assistant:

bool PresetBoolHelper(bool& out, const Json::Value* value, cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Bool();
  return helper(out, value, state);
}